

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::InsertIntoBucketImpl<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           *this,unsigned_long *Key,unsigned_long *Lookup,
          DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *TheBucket)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long *LHS;
  unsigned_long local_38;
  unsigned_long EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *TheBucket_local;
  unsigned_long *Lookup_local;
  unsigned_long *Key_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)Lookup;
  Lookup_local = Key;
  Key_local = (unsigned_long *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar3 = getNumEntries(this);
  EmptyKey._4_4_ = uVar3 + 1;
  uVar3 = getNumBuckets(this);
  iVar1 = EmptyKey._4_4_;
  EmptyKey._0_4_ = uVar3;
  if ((uint)(EmptyKey._4_4_ << 2) < uVar3 * 3) {
    uVar4 = getNumTombstones(this);
    if (uVar3 - (iVar1 + uVar4) <= (uint)EmptyKey >> 3) {
      grow(this,(uint)EmptyKey);
      LookupBucketFor<unsigned_long>
                (this,(unsigned_long *)TheBucket_local,
                 (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> **)
                 &NumBuckets);
    }
  }
  else {
    grow(this,uVar3 << 1);
    LookupBucketFor<unsigned_long>
              (this,(unsigned_long *)TheBucket_local,
               (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> **)&NumBuckets
              );
    EmptyKey._0_4_ = getNumBuckets(this);
  }
  if (_NumBuckets == (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x22f,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, unsigned long, const llvm::DWARFDebugNames::NameIndex *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, LookupKeyT = unsigned long]"
                 );
  }
  incrementNumEntries(this);
  local_38 = getEmptyKey();
  LHS = detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>::getFirst
                  (_NumBuckets);
  bVar2 = DenseMapInfo<unsigned_long>::isEqual(LHS,&local_38);
  if (!bVar2) {
    decrementNumTombstones(this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }